

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O0

int __thiscall cm::uv_loop_ptr::init(uv_loop_ptr *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  void *pvVar2;
  element_type *peVar3;
  element_type *loop;
  void *data_local;
  uv_loop_ptr *this_local;
  
  reset(this);
  pvVar2 = calloc(1,0x350);
  std::__shared_ptr<uv_loop_s,(__gnu_cxx::_Lock_policy)2>::reset<uv_loop_s,cm::uv_loop_deleter>
            ((__shared_ptr<uv_loop_s,(__gnu_cxx::_Lock_policy)2> *)this,pvVar2);
  peVar3 = std::__shared_ptr_access<uv_loop_s,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<uv_loop_s,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  peVar3->data = ctx;
  loop = std::__shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2> *)this);
  iVar1 = uv_loop_init(loop);
  return iVar1;
}

Assistant:

int uv_loop_ptr::init(void* data)
{
  this->reset();

  this->loop.reset(static_cast<uv_loop_t*>(calloc(1, sizeof(uv_loop_t))),
                   uv_loop_deleter());
  this->loop->data = data;

  return uv_loop_init(this->loop.get());
}